

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacket.h
# Opt level: O1

void __thiscall
jrtplib::RTCPScheduler::AnalyseIncoming(RTCPScheduler *this,RTCPCompoundPacket *rtcpcomppack)

{
  size_t sVar1;
  long lVar2;
  ulong uVar3;
  _List_node_base *p_Var4;
  bool bVar5;
  bool bVar6;
  _List_node_base *p_Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  
  p_Var4 = (rtcpcomppack->rtcppacklist).
           super__List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  (rtcpcomppack->rtcppackit)._M_node = p_Var4;
  bVar5 = false;
  do {
    if (p_Var4 == (_List_node_base *)&rtcpcomppack->rtcppacklist) {
      p_Var7 = (_List_node_base *)0x0;
    }
    else {
      p_Var7 = p_Var4[1]._M_next;
      p_Var4 = p_Var4->_M_next;
      (rtcpcomppack->rtcppackit)._M_node = p_Var4;
    }
    if (p_Var7 == (_List_node_base *)0x0) {
      lVar2 = rtcpcomppack->compoundpacketlength + this->headeroverhead;
      auVar10._8_4_ = (int)((ulong)lVar2 >> 0x20);
      auVar10._0_8_ = lVar2;
      auVar10._12_4_ = 0x45300000;
      sVar1 = this->avgrtcppacksize;
      auVar11._8_4_ = (int)(sVar1 >> 0x20);
      auVar11._0_8_ = sVar1;
      auVar11._12_4_ = 0x45300000;
      dVar12 = ((auVar10._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) * 0.0625 +
               ((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 0.9375;
      uVar3 = (ulong)dVar12;
      this->avgrtcppacksize = (long)(dVar12 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
      return;
    }
    bVar6 = true;
    if (*(int *)((long)&p_Var7[1]._M_prev + 4) != 3) {
      bVar6 = bVar5;
    }
    bVar5 = bVar6;
  } while (!bVar6);
  if (this->byescheduled == true) {
    lVar2 = rtcpcomppack->compoundpacketlength + this->headeroverhead;
    auVar8._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar8._0_8_ = lVar2;
    auVar8._12_4_ = 0x45300000;
    sVar1 = this->avgbyepacketsize;
    auVar9._8_4_ = (int)(sVar1 >> 0x20);
    auVar9._0_8_ = sVar1;
    auVar9._12_4_ = 0x45300000;
    dVar12 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) * 0.0625 +
             ((auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 0.9375;
    uVar3 = (ulong)dVar12;
    this->avgbyepacketsize = (long)(dVar12 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
    this->byemembers = this->byemembers + 1;
  }
  return;
}

Assistant:

void GotoFirstPacket()									{ rtcppackit = rtcppacklist.begin(); }